

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_buildBlockEntropyStats
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,
                 ZSTD_entropyCTablesMetadata_t *entropyMetadata,void *workspace,size_t wkspSize)

{
  BYTE *pBVar1;
  BYTE *pBVar2;
  BYTE *src;
  int hufFlags_00;
  int literalsCompressionIsDisabled;
  uint uVar3;
  size_t sVar4;
  size_t err_code_1;
  size_t err_code;
  int hufFlags;
  int huf_useOptDepth;
  size_t litSize;
  void *workspace_local;
  ZSTD_entropyCTablesMetadata_t *entropyMetadata_local;
  ZSTD_CCtx_params *cctxParams_local;
  ZSTD_entropyCTables_t *nextEntropy_local;
  ZSTD_entropyCTables_t *prevEntropy_local;
  seqStore_t *seqStorePtr_local;
  
  pBVar1 = seqStorePtr->lit;
  pBVar2 = seqStorePtr->litStart;
  hufFlags_00 = 0;
  if (ZSTD_btopt < (cctxParams->cParams).strategy) {
    hufFlags_00 = 2;
  }
  src = seqStorePtr->litStart;
  literalsCompressionIsDisabled = ZSTD_literalsCompressionIsDisabled(cctxParams);
  sVar4 = ZSTD_buildBlockEntropyStats_literals
                    (src,(long)pBVar1 - (long)pBVar2,&prevEntropy->huf,&nextEntropy->huf,
                     &entropyMetadata->hufMetadata,literalsCompressionIsDisabled,workspace,wkspSize,
                     hufFlags_00);
  (entropyMetadata->hufMetadata).hufDesSize = sVar4;
  seqStorePtr_local = (seqStore_t *)(entropyMetadata->hufMetadata).hufDesSize;
  uVar3 = ERR_isError((size_t)seqStorePtr_local);
  if (uVar3 == 0) {
    sVar4 = ZSTD_buildBlockEntropyStats_sequences
                      (seqStorePtr,&prevEntropy->fse,&nextEntropy->fse,cctxParams,
                       &entropyMetadata->fseMetadata,workspace,wkspSize);
    (entropyMetadata->fseMetadata).fseTablesSize = sVar4;
    seqStorePtr_local = (seqStore_t *)(entropyMetadata->fseMetadata).fseTablesSize;
    uVar3 = ERR_isError((size_t)seqStorePtr_local);
    if (uVar3 == 0) {
      seqStorePtr_local = (seqStore_t *)0x0;
    }
  }
  return (size_t)seqStorePtr_local;
}

Assistant:

size_t ZSTD_buildBlockEntropyStats(
            const seqStore_t* seqStorePtr,
            const ZSTD_entropyCTables_t* prevEntropy,
                  ZSTD_entropyCTables_t* nextEntropy,
            const ZSTD_CCtx_params* cctxParams,
                  ZSTD_entropyCTablesMetadata_t* entropyMetadata,
                  void* workspace, size_t wkspSize)
{
    size_t const litSize = (size_t)(seqStorePtr->lit - seqStorePtr->litStart);
    int const huf_useOptDepth = (cctxParams->cParams.strategy >= HUF_OPTIMAL_DEPTH_THRESHOLD);
    int const hufFlags = huf_useOptDepth ? HUF_flags_optimalDepth : 0;

    entropyMetadata->hufMetadata.hufDesSize =
        ZSTD_buildBlockEntropyStats_literals(seqStorePtr->litStart, litSize,
                                            &prevEntropy->huf, &nextEntropy->huf,
                                            &entropyMetadata->hufMetadata,
                                            ZSTD_literalsCompressionIsDisabled(cctxParams),
                                            workspace, wkspSize, hufFlags);

    FORWARD_IF_ERROR(entropyMetadata->hufMetadata.hufDesSize, "ZSTD_buildBlockEntropyStats_literals failed");
    entropyMetadata->fseMetadata.fseTablesSize =
        ZSTD_buildBlockEntropyStats_sequences(seqStorePtr,
                                              &prevEntropy->fse, &nextEntropy->fse,
                                              cctxParams,
                                              &entropyMetadata->fseMetadata,
                                              workspace, wkspSize);
    FORWARD_IF_ERROR(entropyMetadata->fseMetadata.fseTablesSize, "ZSTD_buildBlockEntropyStats_sequences failed");
    return 0;
}